

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b_rle.h
# Opt level: O1

uint32_t FastPForLib::Simple8b_Codec::tryRunLength(uint32_t *input,uint32_t pos,uint32_t count)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  uVar6 = count + pos;
  uVar1 = input[pos];
  uVar4 = pos;
  uVar2 = pos + 1;
  if (pos + 1 < uVar6) {
    uVar2 = uVar6;
  }
  do {
    uVar4 = uVar4 + 1;
    uVar5 = uVar2;
    if (uVar6 <= uVar4) break;
    uVar5 = uVar4;
  } while (uVar1 == input[uVar4]);
  uVar2 = uVar1 >> 0x10;
  if (0x7fff >= uVar1) {
    uVar2 = uVar1 | 1;
  }
  iVar8 = (uint)(0x7fff < uVar1) * 0x10;
  iVar7 = iVar8 + 8;
  uVar1 = uVar2 >> 8;
  if (uVar2 < 0x80) {
    iVar7 = iVar8;
    uVar1 = uVar2;
  }
  iVar8 = iVar7 + 4;
  uVar2 = uVar1 >> 4;
  if (uVar1 < 8) {
    iVar8 = iVar7;
    uVar2 = uVar1;
  }
  iVar7 = iVar8 + 2;
  uVar1 = uVar2 >> 2;
  if (uVar2 < 2) {
    iVar7 = iVar8;
    uVar1 = uVar2;
  }
  uVar3 = 0;
  if (0x3b < ((iVar7 + 1) - (uint)(uVar1 == 0)) * (uVar5 - pos)) {
    uVar3 = uVar5 - pos;
  }
  return uVar3;
}

Assistant:

static uint32_t tryRunLength(const uint32_t *input, uint32_t pos,
                               uint32_t count) {
    uint32_t startPos = pos;
    uint32_t endPos = pos + count;
    uint32_t test = input[pos++];
    if (test > RLE_MAX_VALUE_MASK)
      return 0;
    while (pos < endPos && test == input[pos]) {
      pos++;
    }
    uint32_t bitLen = bits(test | 1U);
    uint32_t repeatCount = (pos - startPos);
    return (bitLen * repeatCount >= SIMPLE8B_BITSIZE) ? repeatCount : 0;
  }